

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getHeld(TestMoreStuffImpl *this,GetHeldContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Maybe<capnp::MessageSize> local_60;
  undefined1 local_48 [8];
  Builder result;
  TestMoreStuffImpl *this_local;
  GetHeldContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  result._builder._32_8_ = context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_60,(void *)0x0);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::getResults((Builder *)local_48,
               (CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
                *)&this_local,&local_60);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Builder::setCap
            ((Builder *)local_48,(Client *)(context.hook + 3));
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getHeld(GetHeldContext context) {
  ++callCount;
  auto result = context.getResults();
  result.setCap(clientToHold);
  return kj::READY_NOW;
}